

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnmatch.cc
# Opt level: O1

bool absl::lts_20240722::log_internal::FNMatch(string_view pattern,string_view str)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_50._M_str = str._M_str;
  local_50._M_len = str._M_len;
  pcVar5 = pattern._M_str;
  sVar6 = pattern._M_len;
  if (sVar6 != 0) {
    bVar2 = false;
    do {
      if (local_50._M_len == 0) {
        sVar4 = 0;
        goto LAB_0010125e;
      }
      cVar1 = *pcVar5;
      if (cVar1 == '?') {
LAB_0010123b:
        local_50._M_str = local_50._M_str + 1;
        sVar6 = sVar6 - 1;
        pcVar5 = pcVar5 + 1;
        local_50._M_len = local_50._M_len - 1;
      }
      else if (cVar1 == '*') {
        pcVar5 = pcVar5 + 1;
        sVar6 = sVar6 - 1;
        bVar2 = true;
      }
      else {
        if (!bVar2) {
          if (cVar1 != *local_50._M_str) {
            return false;
          }
          goto LAB_0010123b;
        }
        local_40._M_len = sVar6;
        local_40._M_str = pcVar5;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (&local_40,"*?",0,2);
        sVar4 = local_40._M_len;
        if ((sVar3 != 0xffffffffffffffff) && (sVar4 = sVar3, local_40._M_len < sVar3)) {
          sVar4 = local_40._M_len;
        }
        local_40._M_len = sVar4;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (&local_50,local_40._M_str,0,local_40._M_len);
        if (sVar3 == 0xffffffffffffffff) {
          return false;
        }
        pcVar5 = pcVar5 + local_40._M_len;
        sVar6 = sVar6 - local_40._M_len;
        local_50._M_str = local_50._M_str + local_40._M_len + sVar3;
        local_50._M_len = local_50._M_len - (local_40._M_len + sVar3);
        bVar2 = false;
      }
    } while (sVar6 != 0);
    if (bVar2) {
      return true;
    }
  }
  return local_50._M_len == 0;
  while (sVar4 = sVar4 + 1, sVar6 != sVar4) {
LAB_0010125e:
    if (pcVar5[sVar4] != '*') goto LAB_00101273;
  }
  sVar4 = 0xffffffffffffffff;
LAB_00101273:
  return sVar4 == 0xffffffffffffffff;
}

Assistant:

bool FNMatch(absl::string_view pattern, absl::string_view str) {
  bool in_wildcard_match = false;
  while (true) {
    if (pattern.empty()) {
      // `pattern` is exhausted; succeed if all of `str` was consumed matching
      // it.
      return in_wildcard_match || str.empty();
    }
    if (str.empty()) {
      // `str` is exhausted; succeed if `pattern` is empty or all '*'s.
      return pattern.find_first_not_of('*') == pattern.npos;
    }
    switch (pattern.front()) {
      case '*':
        pattern.remove_prefix(1);
        in_wildcard_match = true;
        break;
      case '?':
        pattern.remove_prefix(1);
        str.remove_prefix(1);
        break;
      default:
        if (in_wildcard_match) {
          absl::string_view fixed_portion = pattern;
          const size_t end = fixed_portion.find_first_of("*?");
          if (end != fixed_portion.npos) {
            fixed_portion = fixed_portion.substr(0, end);
          }
          const size_t match = str.find(fixed_portion);
          if (match == str.npos) {
            return false;
          }
          pattern.remove_prefix(fixed_portion.size());
          str.remove_prefix(match + fixed_portion.size());
          in_wildcard_match = false;
        } else {
          if (pattern.front() != str.front()) {
            return false;
          }
          pattern.remove_prefix(1);
          str.remove_prefix(1);
        }
        break;
    }
  }
}